

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::ECMust
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,EncodedChar ec,HRESULT error)

{
  code *pcVar1;
  bool bVar2;
  EncodedChar EVar3;
  undefined4 *puVar4;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,ec) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x254,"(ec != 0)","ec != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  EVar3 = ECLookahead(this,0);
  if (EVar3 != ec) {
    Fail(this,error);
  }
  ECConsume(this,1);
  return;
}

Assistant:

inline void Parser<P, IsLiteral>::ECMust(EncodedChar ec, HRESULT error)
    {
        // We never look for 0
        Assert(ec != 0);
        if (ECLookahead() != ec)
            Fail(error);
        ECConsume();
    }